

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall
camp::NotEnoughArguments::NotEnoughArguments
          (NotEnoughArguments *this,string *functionName,size_t provided,size_t expected)

{
  unsigned_long in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::operator+(&local_40,"not enough arguments for calling ",functionName);
  std::operator+(&local_c0,&local_40," - provided ");
  Error::str<unsigned_long>(in_stack_fffffffffffffef8);
  std::operator+(&local_a0,&local_c0,&local_e0);
  std::operator+(&local_80,&local_a0,", expected ");
  Error::str<unsigned_long>(in_stack_fffffffffffffef8);
  std::operator+(&local_60,&local_80,&local_100);
  Error::Error(&this->super_Error,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_40);
  *(undefined ***)&this->super_Error = &PTR__Error_001415e8;
  return;
}

Assistant:

NotEnoughArguments::NotEnoughArguments(const std::string& functionName, std::size_t provided, std::size_t expected)
    : Error("not enough arguments for calling " + functionName + " - provided " + str(provided) + ", expected " + str(expected))
{
}